

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataStatePtr xmlAutomataNewState(xmlAutomataPtr am)

{
  xmlRegStatePtr state;
  
  if (am == (xmlAutomataPtr)0x0) {
    state = (xmlRegStatePtr)0x0;
  }
  else {
    state = xmlRegNewState(am);
    xmlRegStatePush(am,state);
  }
  return state;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewState(xmlAutomataPtr am) {
    xmlAutomataStatePtr to;

    if (am == NULL)
	return(NULL);
    to = xmlRegNewState(am);
    xmlRegStatePush(am, to);
    return(to);
}